

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  bool bVar1;
  ulong local_50;
  uint local_3c;
  uint string2_begin;
  uint length;
  char *str;
  char *key;
  uint error;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGInfo *info_local;
  
  str = (char *)0x0;
  _string2_begin = (char *)0x0;
  local_3c = 0;
  while( true ) {
    bVar1 = false;
    if (local_3c < chunkLength) {
      bVar1 = data[local_3c] != '\0';
    }
    if (!bVar1) break;
    local_3c = local_3c + 1;
  }
  if ((local_3c == 0) || (0x4f < local_3c)) {
    key._4_4_ = 0x59;
  }
  else {
    str = (char *)lodepng_malloc((ulong)(local_3c + 1));
    if (str == (char *)0x0) {
      key._4_4_ = 0x53;
    }
    else {
      lodepng_memcpy(str,data,(ulong)local_3c);
      str[local_3c] = '\0';
      local_3c = local_3c + 1;
      if (chunkLength < local_3c) {
        local_50 = 0;
      }
      else {
        local_50 = chunkLength - local_3c;
      }
      _string2_begin = (char *)lodepng_malloc((ulong)((int)local_50 + 1));
      if (_string2_begin == (char *)0x0) {
        key._4_4_ = 0x53;
      }
      else {
        lodepng_memcpy(_string2_begin,data + local_3c,local_50 & 0xffffffff);
        _string2_begin[local_50 & 0xffffffff] = '\0';
        key._4_4_ = lodepng_add_text(info,str,_string2_begin);
      }
    }
  }
  lodepng_free(str);
  lodepng_free(_string2_begin);
  return key._4_4_;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  char *key = 0, *str = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = (unsigned)(chunkLength < string2_begin ? 0 : chunkLength - string2_begin);
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(str, data + string2_begin, length);
    str[length] = 0;

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}